

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcSymDynLocal::gen_code(CTcSymDynLocal *this,int discard)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  long intval;
  
  if (discard != 0) {
    return;
  }
  CTcGenTarg::write_op(G_cg,'\a');
  CTcDataStream::write_obj_id
            (&G_cs->super_CTcDataStream,(ulong)(this->super_CTcSymDynLocalBase).fref_);
  pCVar3 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar3->max_sp_depth_ <= iVar2) {
    pCVar3->max_sp_depth_ = iVar1;
  }
  CTPNConst::s_gen_code_int((long)(this->super_CTcSymDynLocalBase).varnum_);
  CTcGenTarg::write_op(G_cg,0xba);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  intval = (long)(this->super_CTcSymDynLocalBase).ctxidx_;
  if (intval != 0) {
    CTPNConst::s_gen_code_int(intval);
    CTcGenTarg::write_op(G_cg,0xba);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  return;
}

Assistant:

void CTcSymDynLocal::gen_code(int discard)
{
    /* there are no side effects, so do nothing if discarding the value */
    if (discard)
        return;

    /* 
     *   to retrieve a dynamic frame local, we simply need to evaluate
     *   fref[index], where 'fref' is the StackFrameRef object and 'index' is
     *   an integer giving the frame index of the variable 
     */

    /* push the frame object */
    G_cg->write_op(OPC_PUSHOBJ);
    G_cs->write_obj_id(fref_);
    G_cg->note_push();

    /* push the variable's frame index */
    CTPNConst::s_gen_code_int(varnum_);

    /* index the frame object */
    G_cg->write_op(OPC_INDEX);

    /* INDEX pops two items and pushes one for a net of one pop */
    G_cg->note_pop(1);

    /* 
     *   if this is a context local, we now have the context object, so we
     *   need to further index it by the variable's context index 
     */
    if (ctxidx_ != 0)
    {
        /* index the context object by the context index */
        CTPNConst::s_gen_code_int(ctxidx_);
        G_cg->write_op(OPC_INDEX);

        /* INDEX pops two items and pushes one */
        G_cg->note_pop(1);
    }
}